

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestViewSampling::initIterationSpecificProgramObject
          (TextureViewTestViewSampling *this)

{
  GLenum GVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  GLint GVar5;
  undefined4 extraout_var;
  ulong uVar7;
  MessageBuilder *this_00;
  TestError *pTVar8;
  GLuint *pGVar9;
  long lVar10;
  GLint compile_status;
  string sampler_declarations_string;
  string sample_fetch_string;
  char *vs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  char *gs_body_raw_ptr;
  char *fs_body_raw_ptr;
  string fs_string;
  string gs_string;
  string te_string;
  string tc_string;
  string vs_string;
  string sample_fetch_fs_string;
  GLchar *shader_sources [5];
  GLuint local_758 [4];
  GLuint local_748;
  stringstream n_samples_sstream;
  undefined1 local_730 [376];
  char *varying_names [4];
  GLint link_status;
  uint uStack_1ac;
  ostringstream local_1a8 [376];
  long lVar6;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  deinitIterationSpecificProgramAndShaderObjects(this);
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8e88);
  this->m_tc_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8e87);
  this->m_te_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x12fd);
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1300);
  std::__cxx11::stringstream::stringstream((stringstream *)&n_samples_sstream);
  sampler_declarations_string._M_dataplus._M_p = (pointer)&sampler_declarations_string.field_2;
  sampler_declarations_string._M_string_length = 0;
  sampler_declarations_string.field_2._M_local_buf[0] = '\0';
  sample_fetch_string._M_dataplus._M_p = (pointer)&sample_fetch_string.field_2;
  sample_fetch_string._M_string_length = 0;
  sample_fetch_fs_string._M_dataplus._M_p = (pointer)&sample_fetch_fs_string.field_2;
  sample_fetch_fs_string._M_string_length = 0;
  sample_fetch_string.field_2._M_local_buf[0] = '\0';
  sample_fetch_fs_string.field_2._M_local_buf[0] = '\0';
  std::ostream::_M_insert<unsigned_long>((ulong)local_730);
  GVar1 = this->m_iteration_view_texture_target;
  if (GVar1 == 0xde0) {
    std::__cxx11::string::assign((char *)&sampler_declarations_string);
    std::__cxx11::string::assign((char *)&sample_fetch_string);
  }
  else if (GVar1 == 0xde1) {
    std::__cxx11::string::assign((char *)&sampler_declarations_string);
    std::__cxx11::string::assign((char *)&sample_fetch_string);
  }
  else {
    if (GVar1 != 0x806f) {
      if (GVar1 == 0x84f5) {
        std::__cxx11::string::assign((char *)&sampler_declarations_string);
        std::__cxx11::string::assign((char *)&sample_fetch_string);
        goto LAB_00aa97e1;
      }
      if (GVar1 == 0x8513) {
        std::__cxx11::string::assign((char *)&sampler_declarations_string);
        std::__cxx11::string::assign((char *)&sample_fetch_string);
        goto LAB_00aa97e1;
      }
      if (GVar1 == 0x8c18) {
        std::__cxx11::string::assign((char *)&sampler_declarations_string);
        std::__cxx11::string::assign((char *)&sample_fetch_string);
        goto LAB_00aa97e1;
      }
      if (GVar1 != 0x8c1a) {
        if (GVar1 == 0x9009) {
          std::__cxx11::string::assign((char *)&sampler_declarations_string);
          std::__cxx11::string::assign((char *)&sample_fetch_string);
        }
        else if (GVar1 == 0x9100) {
          std::__cxx11::string::assign((char *)&sampler_declarations_string);
          std::__cxx11::string::assign((char *)&sample_fetch_string);
        }
        else {
          if (GVar1 != 0x9102) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,"Unrecognized texture target",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x13d7);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          std::__cxx11::string::assign((char *)&sampler_declarations_string);
          std::__cxx11::string::assign((char *)&sample_fetch_string);
        }
        goto LAB_00aa97e1;
      }
    }
    std::__cxx11::string::assign((char *)&sampler_declarations_string);
    std::__cxx11::string::assign((char *)&sample_fetch_string);
  }
LAB_00aa97e1:
  std::__cxx11::string::assign((char *)&sample_fetch_fs_string);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_string,
             "#version 400\n\nuniform float lod;\nuniform vec4 reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nout int vs_tc_vs_sampling_result;\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    vs_tc_vs_sampling_result = 1;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH;\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            vs_tc_vs_sampling_result = int(current_sample.x * 256.0);\n\n            break;\n        }\n    }\n\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)varying_names);
  while (uVar7 = std::__cxx11::string::find((char *)&vs_string,0x16efbf5),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)&vs_string,uVar7,(string *)0x9);
    std::__cxx11::string::~string((string *)varying_names);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&vs_string,0x16efbff),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&vs_string,uVar7,(string *)0x14);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&vs_string,0x16efc14),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&vs_string,uVar7,(string *)0xc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tc_string,
             "#version 400\n\nlayout(vertices = 1) out;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nin  int vs_tc_vs_sampling_result[];\nout int tc_te_vs_sampling_result[];\nout int tc_te_tc_sampling_result[];\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    tc_te_vs_sampling_result[gl_InvocationID] = vs_tc_vs_sampling_result[gl_InvocationID];\n    tc_te_tc_sampling_result[gl_InvocationID] = 1;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            tc_te_tc_sampling_result[gl_InvocationID] = 0;\n\n            break;\n        }\n    }\n\n   gl_TessLevelInner[0] = 1.0;\n   gl_TessLevelInner[1] = 1.0;\n   gl_TessLevelOuter[0] = 1.0;\n   gl_TessLevelOuter[1] = 1.0;\n   gl_TessLevelOuter[2] = 1.0;\n   gl_TessLevelOuter[3] = 1.0;\n}\n"
             ,(allocator<char> *)varying_names);
  while (uVar7 = std::__cxx11::string::find((char *)&tc_string,0x16efbf5),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)&tc_string,uVar7,(string *)0x9);
    std::__cxx11::string::~string((string *)varying_names);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&tc_string,0x16efbff),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&tc_string,uVar7,(string *)0x14);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&tc_string,0x16efc14),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&tc_string,uVar7,(string *)0xc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&te_string,
             "#version 400\n\nlayout(quads) in;\n\nin  int  tc_te_vs_sampling_result[];\nin  int  tc_te_tc_sampling_result[];\nout int  te_gs_vs_sampling_result;\nout int  te_gs_tc_sampling_result;\nout int  te_gs_te_sampling_result;\nout vec2 te_gs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nvoid main()\n{\n    te_gs_vs_sampling_result = tc_te_vs_sampling_result[0];\n    te_gs_tc_sampling_result = tc_te_tc_sampling_result[0];\n    te_gs_te_sampling_result = 1;\n\n    gl_Position.xy = gl_TessCoord.xy * 2.0 - 1.0;\n    gl_Position.zw = vec2(0, 1);\n    te_gs_uv       = vec2(gl_TessCoord.x, 1.0 - gl_TessCoord.y);\n\n\n    const float epsilon = 1.0 / 255.0;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            te_gs_te_sampling_result = 0;\n\n            break;\n        }\n    }\n\n}\n"
             ,(allocator<char> *)varying_names);
  while (uVar7 = std::__cxx11::string::find((char *)&te_string,0x16efbf5),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)&te_string,uVar7,(string *)0x9);
    std::__cxx11::string::~string((string *)varying_names);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&te_string,0x16efbff),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&te_string,uVar7,(string *)0x14);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&te_string,0x16efc14),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&te_string,uVar7,(string *)0xc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gs_string,
             "#version 400\n\nlayout (triangles)                        in;\nlayout (triangle_strip, max_vertices = 3) out;\n\nin  int  te_gs_vs_sampling_result[];\nin  int  te_gs_tc_sampling_result[];\nin  int  te_gs_te_sampling_result[];\nin  vec2 te_gs_uv                [];\nout int  gs_fs_vs_sampling_result;\nout int  gs_fs_tc_sampling_result;\nout int  gs_fs_te_sampling_result;\nout int  gs_fs_gs_sampling_result;\nout vec2 gs_fs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nvoid main()\n{\n    const float epsilon            = 1.0 / 255.0;\n    int         gs_sampling_result = 1;\n    int         tc_sampling_result = te_gs_tc_sampling_result[0] & te_gs_tc_sampling_result[1] & te_gs_tc_sampling_result[2];\n    int         te_sampling_result = te_gs_te_sampling_result[0] & te_gs_te_sampling_result[1] & te_gs_te_sampling_result[2];\n    int         vs_sampling_result = te_gs_vs_sampling_result[0] & te_gs_vs_sampling_result[1] & te_gs_vs_sampling_result[2];\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH;\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            gs_sampling_result = 0;\n\n            break;\n        }\n    }\n\n    gl_Position              = gl_in[0].gl_Position;\n    gs_fs_uv                 = te_gs_uv[0];\n    gs_fs_gs_sampling_result = gs_sampling_result;\n    gs_fs_tc_sampling_result = tc_sampling_result;\n    gs_fs_te_sampling_result = te_sampling_result;\n    gs_fs_vs_sampling_result = vs_sampling_result;\n    EmitVertex();\n\n    gl_Position              = gl_in[1].gl_Position;\n    gs_fs_uv                 = te_gs_uv[1];\n    gs_fs_gs_sampling_result = gs_sampling_result;\n    gs_fs_tc_sampling_result = tc_sampling_result;\n    gs_fs_te_sampling_result = te_sampling_result;\n    gs_fs_vs..." /* TRUNCATED STRING LITERAL */
             ,(allocator<char> *)varying_names);
  while (uVar7 = std::__cxx11::string::find((char *)&gs_string,0x16efbf5),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)&gs_string,uVar7,(string *)0x9);
    std::__cxx11::string::~string((string *)varying_names);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&gs_string,0x16efbff),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&gs_string,uVar7,(string *)0x14);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&gs_string,0x16efc14),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&gs_string,uVar7,(string *)0xc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs_string,
             "#version 400\n\nin vec2 gs_fs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nout vec4 result;\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    result = vec4(1.0);\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            result = vec4(0.0);\n\n            break;\n        }\n    }\n}\n"
             ,(allocator<char> *)varying_names);
  while (uVar7 = std::__cxx11::string::find((char *)&fs_string,0x16efbf5),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)&fs_string,uVar7,(string *)0x9);
    std::__cxx11::string::~string((string *)varying_names);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&fs_string,0x16efbff),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&fs_string,uVar7,(string *)0x14);
  }
  while (uVar7 = std::__cxx11::string::find((char *)&fs_string,0x16efc14),
        uVar7 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&fs_string,uVar7,(string *)0xc);
  }
  fs_body_raw_ptr = fs_string._M_dataplus._M_p;
  gs_body_raw_ptr = gs_string._M_dataplus._M_p;
  tc_body_raw_ptr = tc_string._M_dataplus._M_p;
  te_body_raw_ptr = te_string._M_dataplus._M_p;
  vs_body_raw_ptr = vs_string._M_dataplus._M_p;
  (**(code **)(lVar6 + 0x12b8))(this->m_fs_id,1,&fs_body_raw_ptr,0);
  (**(code **)(lVar6 + 0x12b8))(this->m_gs_id,1,&gs_body_raw_ptr,0);
  (**(code **)(lVar6 + 0x12b8))(this->m_tc_id,1,&tc_body_raw_ptr,0);
  (**(code **)(lVar6 + 0x12b8))(this->m_te_id,1,&te_body_raw_ptr,0);
  (**(code **)(lVar6 + 0x12b8))(this->m_vs_id,1,&vs_body_raw_ptr,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1520);
  pGVar9 = local_758;
  local_758[0] = this->m_fs_id;
  local_758[1] = this->m_gs_id;
  local_758[2] = this->m_tc_id;
  local_758[3] = this->m_te_id;
  local_748 = this->m_vs_id;
  shader_sources[0] = fs_body_raw_ptr;
  shader_sources[1] = gs_body_raw_ptr;
  shader_sources[2] = tc_body_raw_ptr;
  shader_sources[3] = te_body_raw_ptr;
  shader_sources[4] = vs_body_raw_ptr;
  lVar10 = 0;
  while( true ) {
    if (lVar10 == -0x28) {
      varying_names[2] = "gs_fs_te_sampling_result";
      varying_names[3] = "gs_fs_gs_sampling_result";
      varying_names[0]._0_4_ = 0x16f2698;
      varying_names[0]._4_4_ = 0;
      varying_names[1]._0_4_ = 0x16f26b1;
      varying_names[1]._4_4_ = 0;
      (**(code **)(lVar6 + 0x14c8))(this->m_po_id,4,varying_names,0x8c8c);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glTransformFeedbackVaryings() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x154c);
      _link_status = (TestLog *)((ulong)uStack_1ac << 0x20);
      (**(code **)(lVar6 + 0xce8))(this->m_po_id);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1552);
      (**(code **)(lVar6 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1555);
      if (link_status == 1) {
        GVar5 = (**(code **)(lVar6 + 0xb48))(this->m_po_id,"lod");
        this->m_po_lod_location = GVar5;
        GVar5 = (**(code **)(lVar6 + 0xb48))(this->m_po_id,"n_face");
        this->m_po_n_face_location = GVar5;
        GVar5 = (**(code **)(lVar6 + 0xb48))(this->m_po_id,"reference_colors");
        this->m_po_reference_colors_location = GVar5;
        GVar5 = (**(code **)(lVar6 + 0xb48))(this->m_po_id,"texture");
        this->m_po_texture_location = GVar5;
        GVar5 = (**(code **)(lVar6 + 0xb48))(this->m_po_id,"z_float");
        this->m_po_z_float_location = GVar5;
        GVar5 = (**(code **)(lVar6 + 0xb48))(this->m_po_id,"z_int");
        this->m_po_z_int_location = GVar5;
        if (this->m_po_reference_colors_location != -1) {
          std::__cxx11::string::~string((string *)&fs_string);
          std::__cxx11::string::~string((string *)&gs_string);
          std::__cxx11::string::~string((string *)&te_string);
          std::__cxx11::string::~string((string *)&tc_string);
          std::__cxx11::string::~string((string *)&vs_string);
          std::__cxx11::string::~string((string *)&sample_fetch_fs_string);
          std::__cxx11::string::~string((string *)&sample_fetch_string);
          std::__cxx11::string::~string((string *)&sampler_declarations_string);
          std::__cxx11::stringstream::~stringstream((stringstream *)&n_samples_sstream);
          return;
        }
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"reference_colors is considered an inactive uniform which is invalid.",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x1568);
      }
      else {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Program linking failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x1559);
      }
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    compile_status = 0;
    GVar3 = *pGVar9;
    (**(code **)(lVar6 + 0x248))(GVar3);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x152f);
    (**(code **)(lVar6 + 0xa70))(GVar3,0x8b81,&compile_status);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1532);
    if (compile_status != 1) break;
    (**(code **)(lVar6 + 0x10))(this->m_po_id,GVar3);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glAttachShader() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1543);
    lVar10 = lVar10 + -8;
    pGVar9 = pGVar9 + 1;
  }
  (**(code **)(lVar6 + 0xa58))(GVar3,0x400,0,varying_names);
  _link_status = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Shader compilation error log:\n");
  std::operator<<((ostream *)local_1a8,(char *)varying_names);
  std::operator<<((ostream *)local_1a8,"\nShader source:\n");
  this_00 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&link_status,(char **)((long)shader_sources - lVar10));
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
             ,0x153e);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestViewSampling::initIterationSpecificProgramObject()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release shader/program objects that may have been initialized in previous
	 * iterations.
	 */
	deinitIterationSpecificProgramAndShaderObjects();

	/* Create program and shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
	m_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call(s) failed.");

	/* Prepare token replacement strings */
	std::stringstream n_samples_sstream;
	std::string		  sampler_declarations_string;
	std::string		  sample_fetch_string;
	std::string		  sample_fetch_fs_string;
	std::size_t		  token_location			 = std::string::npos;
	const char*		  token_n_samples			 = "N_SAMPLES";
	const char*		  token_sampler_declarations = "SAMPLER_DECLARATIONS";
	const char*		  token_sample_fetch		 = "SAMPLE_FETCH";

	n_samples_sstream << m_iteration_parent_texture_n_samples;

	switch (m_iteration_view_texture_target)
	{
	case GL_TEXTURE_1D:
	{
		sampler_declarations_string = "uniform sampler1D texture;";
		sample_fetch_string			= "vec4 current_sample = textureLod(texture, 0.5,        lod);\n";
		sample_fetch_fs_string		= "vec4 current_sample = textureLod(texture, gs_fs_uv.x, lod);\n";

		break;
	}

	case GL_TEXTURE_1D_ARRAY:
	{
		sampler_declarations_string = "uniform sampler1DArray texture;\n"
									  "uniform float          z_float;\n";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec2(0.5, z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec2(gs_fs_uv.x, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_2D:
	{
		sampler_declarations_string = "uniform sampler2D texture;";
		sample_fetch_string			= "vec4 current_sample = textureLod(texture, vec2(0.5), lod);\n";
		sample_fetch_fs_string		= "vec4 current_sample = textureLod(texture, gs_fs_uv, lod);\n";

		break;
	}

	case GL_TEXTURE_2D_ARRAY:
	{
		sampler_declarations_string = "uniform float          z_float;\n"
									  "uniform sampler2DArray texture;";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec3(vec2(0.5), z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE:
	{
		sampler_declarations_string = "uniform sampler2DMS texture;";
		sample_fetch_string			= "ivec2 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture,\n"
							  "                                   ivec2(texture_size.xy / ivec2(2)),\n"
							  "                                   n_sample);\n";

		sample_fetch_fs_string = "ivec2 texture_size   = textureSize(texture);\n"
								 "vec4  current_sample = texelFetch (texture,\n"
								 "                                   ivec2(gs_fs_uv * vec2(texture_size)),\n"
								 "                                   n_sample);\n";

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
	{
		sampler_declarations_string = "uniform sampler2DMSArray texture;"
									  "uniform int              z_int;\n";

		sample_fetch_string = "ivec3 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture,\n"
							  "                                   ivec3(texture_size.xy / ivec2(2), z_int),\n"
							  "                                   n_sample);\n";

		sample_fetch_fs_string =
			"ivec3 texture_size = textureSize(texture);\n"
			"vec4  current_sample = texelFetch (texture,\n"
			"                                   ivec3(ivec2(gs_fs_uv * vec2(texture_size).xy), z_int),\n"
			"                                   n_sample);\n";

		break;
	}

	case GL_TEXTURE_3D:
	{
		sampler_declarations_string = "uniform sampler3D texture;"
									  "uniform float     z_float;";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec3(vec2(0.5), z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_CUBE_MAP:
	{
		sampler_declarations_string = "uniform samplerCube texture;\n"
									  "uniform int         n_face;";

		sample_fetch_string = "vec4 current_sample;\n"
							  "\n"
							  "switch (n_face)\n"
							  "{\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_X
							  "    case 0: current_sample = textureLod(texture, vec3( 1,  0,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_X
							  "    case 1: current_sample = textureLod(texture, vec3(-1,  0,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_Y
							  "    case 2: current_sample = textureLod(texture, vec3( 0,  1,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
							  "    case 3: current_sample = textureLod(texture, vec3( 0, -1,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_Z
							  "    case 4: current_sample = textureLod(texture, vec3( 0,  0,  1), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
							  "    case 5: current_sample = textureLod(texture, vec3( 0,  0, -1), lod); break;\n"
							  "}\n";

		sample_fetch_fs_string =
			"vec4 current_sample;\n"
			"\n"
			"switch (n_face)\n"
			"{\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_X
			"    case 0: current_sample = textureLod(texture, normalize(vec3( 1, gs_fs_uv.xy)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_X
			"    case 1: current_sample = textureLod(texture, normalize(vec3(-1, gs_fs_uv.xy)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Y
			"    case 2: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, 1,  gs_fs_uv.y)), lod); "
			"break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
			"    case 3: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, -1, gs_fs_uv.y)), lod); "
			"break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Z
			"    case 4: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy,  1)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			"    case 5: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy, -1)), lod); break;\n"
			"}\n";
		break;
	}

	case GL_TEXTURE_CUBE_MAP_ARRAY:
	{
		sampler_declarations_string = "uniform samplerCubeArray texture;\n"
									  "uniform int              n_face;\n"
									  "uniform float            z_float;\n";

		sample_fetch_string =
			"vec4 current_sample;\n"
			"\n"
			"switch (n_face)\n"
			"{\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_X
			"    case 0: current_sample = textureLod(texture, vec4( 1,  0,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_X
			"    case 1: current_sample = textureLod(texture, vec4(-1,  0,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Y
			"    case 2: current_sample = textureLod(texture, vec4( 0,  1,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
			"    case 3: current_sample = textureLod(texture, vec4( 0, -1,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Z
			"    case 4: current_sample = textureLod(texture, vec4( 0,  0,  1, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			"    case 5: current_sample = textureLod(texture, vec4( 0,  0, -1, z_float), lod); break;\n"
			"}\n";

		sample_fetch_fs_string = "vec4 current_sample;\n"
								 "\n"
								 "switch (n_face)\n"
								 "{\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_X
								 "    case 0: current_sample = textureLod(texture, vec4(normalize(vec3( 1, "
								 "gs_fs_uv.xy)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_X
								 "    case 1: current_sample = textureLod(texture, vec4(normalize(vec3(-1, "
								 "gs_fs_uv.xy)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_Y
								 "    case 2: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, 1, "
								 " gs_fs_uv.y)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
								 "    case 3: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, "
								 "-1,  gs_fs_uv.y)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_Z
								 "    case 4: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, "
								 "1)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
								 "    case 5: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, "
								 "-1)), z_float), lod); break;\n"
								 "}\n";

		break;
	}

	case GL_TEXTURE_RECTANGLE:
	{
		sampler_declarations_string = "uniform sampler2DRect texture;";
		sample_fetch_string			= "ivec2 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture, texture_size / ivec2(2));\n";

		sample_fetch_fs_string =
			"ivec2 texture_size   = textureSize(texture);\n"
			"vec4  current_sample = texelFetch (texture, ivec2(gs_fs_uv.xy * vec2(texture_size)));\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized texture target");
	}
	} /* switch (m_iteration_view_texture_target) */

	/* Set vertex shader's body */
	const char* vs_body = "#version 400\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4 reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "out int vs_tc_vs_sampling_result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    vs_tc_vs_sampling_result = 1;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH;\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            vs_tc_vs_sampling_result = int(current_sample.x * 256.0);\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
						  "}\n";
	std::string vs_string = vs_body;

	while ((token_location = vs_string.find(token_n_samples)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = vs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = vs_string.find(token_sample_fetch)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set tessellation control shader's body */
	const char* tc_body = "#version 400\n"
						  "\n"
						  "layout(vertices = 1) out;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "in  int vs_tc_vs_sampling_result[];\n"
						  "out int tc_te_vs_sampling_result[];\n"
						  "out int tc_te_tc_sampling_result[];\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    tc_te_vs_sampling_result[gl_InvocationID] = vs_tc_vs_sampling_result[gl_InvocationID];\n"
						  "    tc_te_tc_sampling_result[gl_InvocationID] = 1;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            tc_te_tc_sampling_result[gl_InvocationID] = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "   gl_TessLevelInner[0] = 1.0;\n"
						  "   gl_TessLevelInner[1] = 1.0;\n"
						  "   gl_TessLevelOuter[0] = 1.0;\n"
						  "   gl_TessLevelOuter[1] = 1.0;\n"
						  "   gl_TessLevelOuter[2] = 1.0;\n"
						  "   gl_TessLevelOuter[3] = 1.0;\n"
						  "}\n";

	std::string tc_string = tc_body;

	while ((token_location = tc_string.find(token_n_samples)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = tc_string.find(token_sampler_declarations)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = tc_string.find(token_sample_fetch)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set tessellation evaluation shader's body */
	const char* te_body = "#version 400\n"
						  "\n"
						  "layout(quads) in;\n"
						  "\n"
						  "in  int  tc_te_vs_sampling_result[];\n"
						  "in  int  tc_te_tc_sampling_result[];\n"
						  "out int  te_gs_vs_sampling_result;\n"
						  "out int  te_gs_tc_sampling_result;\n"
						  "out int  te_gs_te_sampling_result;\n"
						  "out vec2 te_gs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    te_gs_vs_sampling_result = tc_te_vs_sampling_result[0];\n"
						  "    te_gs_tc_sampling_result = tc_te_tc_sampling_result[0];\n"
						  "    te_gs_te_sampling_result = 1;\n"
						  "\n"
						  /* gl_TessCoord spans from 0 to 1 for XY. To generate a screen-space quad,
		 * we need to project these components to <-1, 1>. */
						  "    gl_Position.xy = gl_TessCoord.xy * 2.0 - 1.0;\n"
						  "    gl_Position.zw = vec2(0, 1);\n"
						  "    te_gs_uv       = vec2(gl_TessCoord.x, 1.0 - gl_TessCoord.y);\n"
						  "\n"
						  "\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            te_gs_te_sampling_result = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "}\n";

	std::string te_string = te_body;

	while ((token_location = te_string.find(token_n_samples)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = te_string.find(token_sampler_declarations)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = te_string.find(token_sample_fetch)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set geometry shader's body */
	const char* gs_body = "#version 400\n"
						  "\n"
						  "layout (triangles)                        in;\n"
						  "layout (triangle_strip, max_vertices = 3) out;\n"
						  "\n"
						  "in  int  te_gs_vs_sampling_result[];\n"
						  "in  int  te_gs_tc_sampling_result[];\n"
						  "in  int  te_gs_te_sampling_result[];\n"
						  "in  vec2 te_gs_uv                [];\n"
						  "out int  gs_fs_vs_sampling_result;\n"
						  "out int  gs_fs_tc_sampling_result;\n"
						  "out int  gs_fs_te_sampling_result;\n"
						  "out int  gs_fs_gs_sampling_result;\n"
						  "out vec2 gs_fs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon            = 1.0 / 255.0;\n"
						  "    int         gs_sampling_result = 1;\n"
						  "    int         tc_sampling_result = te_gs_tc_sampling_result[0] & "
						  "te_gs_tc_sampling_result[1] & te_gs_tc_sampling_result[2];\n"
						  "    int         te_sampling_result = te_gs_te_sampling_result[0] & "
						  "te_gs_te_sampling_result[1] & te_gs_te_sampling_result[2];\n"
						  "    int         vs_sampling_result = te_gs_vs_sampling_result[0] & "
						  "te_gs_vs_sampling_result[1] & te_gs_vs_sampling_result[2];\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH;\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            gs_sampling_result = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "    gl_Position              = gl_in[0].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[0];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    gl_Position              = gl_in[1].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[1];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    gl_Position              = gl_in[2].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[2];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "    EndPrimitive();\n"
						  "}\n";

	std::string gs_string = gs_body;

	while ((token_location = gs_string.find(token_n_samples)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = gs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = gs_string.find(token_sample_fetch)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set fragment shader's body */
	const char* fs_body = "#version 400\n"
						  "\n"
						  "in vec2 gs_fs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    result = vec4(1.0);\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            result = vec4(0.0);\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "}\n";

	std::string fs_string = fs_body;

	while ((token_location = fs_string.find(token_n_samples)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = fs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = fs_string.find(token_sample_fetch)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_fs_string);
	}

	/* Configure shader bodies */
	const char* fs_body_raw_ptr = fs_string.c_str();
	const char* gs_body_raw_ptr = gs_string.c_str();
	const char* tc_body_raw_ptr = tc_string.c_str();
	const char* te_body_raw_ptr = te_string.c_str();
	const char* vs_body_raw_ptr = vs_string.c_str();

	gl.shaderSource(m_fs_id, 1 /* count */, &fs_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_gs_id, 1 /* count */, &gs_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_tc_id, 1 /* count */, &tc_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_te_id, 1 /* count */, &te_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");

	/* Compile the shaders */
	const glw::GLuint  so_ids[] = { m_fs_id, m_gs_id, m_tc_id, m_te_id, m_vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	const glw::GLchar* shader_sources[] = { fs_body_raw_ptr, gs_body_raw_ptr, tc_body_raw_ptr, te_body_raw_ptr,
											vs_body_raw_ptr };

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLint compile_status = GL_FALSE;
		glw::GLint so_id		  = so_ids[n_so_id];

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status != GL_TRUE)
		{
			char temp[1024];

			gl.getShaderInfoLog(so_id, 1024, NULL, temp);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation error log:\n"
												<< temp << "\nShader source:\n"
												<< shader_sources[n_so_id] << tcu::TestLog::EndMessage;

			TCU_FAIL("Shader compilation failed");
		}

		/* Attach the shaders to the program object */
		gl.attachShader(m_po_id, so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed");
	} /* for (all shader objects) */

	/* Set up XFB */
	const char* varying_names[] = { "gs_fs_vs_sampling_result", "gs_fs_tc_sampling_result", "gs_fs_te_sampling_result",
									"gs_fs_gs_sampling_result" };
	const unsigned int n_varying_names = sizeof(varying_names) / sizeof(varying_names[0]);

	gl.transformFeedbackVaryings(m_po_id, n_varying_names, varying_names, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	/* Retrieve uniform locations. Depending on the iteration, a number of those will be
	 * inactive.
	 */
	m_po_lod_location			   = gl.getUniformLocation(m_po_id, "lod");
	m_po_n_face_location		   = gl.getUniformLocation(m_po_id, "n_face");
	m_po_reference_colors_location = gl.getUniformLocation(m_po_id, "reference_colors");
	m_po_texture_location		   = gl.getUniformLocation(m_po_id, "texture");
	m_po_z_float_location		   = gl.getUniformLocation(m_po_id, "z_float");
	m_po_z_int_location			   = gl.getUniformLocation(m_po_id, "z_int");

	if (m_po_reference_colors_location == -1)
	{
		TCU_FAIL("reference_colors is considered an inactive uniform which is invalid.");
	}
}